

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::FunctionPortBaseSyntax::isKind(SyntaxKind kind)

{
  return kind == FunctionPort || kind == DefaultFunctionPort;
}

Assistant:

bool FunctionPortBaseSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultFunctionPort:
        case SyntaxKind::FunctionPort:
            return true;
        default:
            return false;
    }
}